

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  int *piVar1;
  int in_ESI;
  int *in_RDI;
  int idx_buffer_old_size;
  int vtx_buffer_old_size;
  ImDrawCmd *draw_cmd;
  int new_size;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  int iVar3;
  
  piVar1 = (int *)(*(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 0x38);
  *piVar1 = in_ESI + *piVar1;
  iVar3 = in_RDI[8];
  new_size = (int)((ulong)in_RDI >> 0x20);
  ImVector<ImDrawVert>::resize
            ((ImVector<ImDrawVert> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),new_size);
  *(long *)(in_RDI + 0x14) = *(long *)(in_RDI + 10) + (long)iVar3 * 0x14;
  iVar2 = in_RDI[4];
  ImVector<unsigned_int>::resize((ImVector<unsigned_int> *)CONCAT44(iVar3,iVar2),new_size);
  *(long *)(in_RDI + 0x16) = *(long *)(in_RDI + 6) + (long)iVar2 * 4;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    // Large mesh support (when enabled)
    IM_ASSERT_PARANOID(idx_count >= 0 && vtx_count >= 0);
    if (sizeof(ImDrawIdx) == 2 && (_VtxCurrentIdx + vtx_count >= (1 << 16)) && (Flags & ImDrawListFlags_AllowVtxOffset))
    {
        _VtxCurrentOffset = VtxBuffer.Size;
        _VtxCurrentIdx = 0;
        AddDrawCmd();
    }

    ImDrawCmd& draw_cmd = CmdBuffer.Data[CmdBuffer.Size - 1];
    draw_cmd.ElemCount += idx_count;

    int vtx_buffer_old_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_old_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_old_size;

    int idx_buffer_old_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_old_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_old_size;
}